

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

RPCHelpMan * getblockheader(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string cond;
  string cond_00;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string m_key_name_12;
  string description_14;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_15;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  RPCExamples examples;
  string description_16;
  string description_17;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  undefined8 uVar9;
  RPCHelpMan *in_RDI;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_ffffffffffffea48;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffea4c;
  undefined8 in_stack_ffffffffffffea58;
  undefined8 in_stack_ffffffffffffea60;
  undefined8 in_stack_ffffffffffffea68;
  code *pcVar12;
  undefined8 in_stack_ffffffffffffea70;
  pointer in_stack_ffffffffffffea78;
  pointer pRVar13;
  pointer in_stack_ffffffffffffea80;
  pointer pRVar14;
  pointer in_stack_ffffffffffffea88;
  pointer pRVar15;
  undefined8 in_stack_ffffffffffffea90;
  pointer in_stack_ffffffffffffea98;
  pointer pRVar16;
  pointer in_stack_ffffffffffffeaa0;
  pointer pRVar17;
  pointer in_stack_ffffffffffffeaa8;
  pointer pRVar18;
  pointer in_stack_ffffffffffffeab0;
  pointer in_stack_ffffffffffffeab8;
  pointer pRVar19;
  pointer in_stack_ffffffffffffeac0;
  pointer pRVar20;
  pointer in_stack_ffffffffffffeac8;
  pointer pRVar21;
  undefined8 in_stack_ffffffffffffead0;
  pointer in_stack_ffffffffffffead8;
  pointer in_stack_ffffffffffffeae0;
  pointer in_stack_ffffffffffffeae8;
  undefined8 in_stack_ffffffffffffeaf0;
  pointer in_stack_ffffffffffffeaf8;
  pointer in_stack_ffffffffffffeb00;
  pointer in_stack_ffffffffffffeb08;
  undefined8 in_stack_ffffffffffffeb10;
  pointer in_stack_ffffffffffffeb18;
  pointer in_stack_ffffffffffffeb20;
  pointer in_stack_ffffffffffffeb28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1488;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1468;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1448;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1428;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1408;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1388;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1370;
  allocator_type local_1352;
  bool local_1351;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1350;
  string local_1338;
  string local_1318;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298;
  ulong *local_1278;
  undefined8 local_1270;
  ulong local_1268;
  undefined8 uStack_1260;
  ulong *local_1258;
  size_type local_1250;
  ulong local_1248;
  undefined8 uStack_1240;
  long *local_1238 [2];
  long local_1228 [2];
  long *local_1218 [2];
  long local_1208 [2];
  long *local_11f8 [2];
  long local_11e8 [2];
  long *local_11d8 [2];
  long local_11c8 [2];
  long *local_11b8 [2];
  long local_11a8 [2];
  long *local_1198 [2];
  long local_1188 [2];
  long *local_1178 [2];
  long local_1168 [2];
  long *local_1158 [2];
  long local_1148 [2];
  long *local_1138 [2];
  long local_1128 [2];
  long *local_1118 [2];
  long local_1108 [2];
  long *local_10f8 [2];
  long local_10e8 [2];
  long *local_10d8 [2];
  long local_10c8 [2];
  long *local_10b8 [2];
  long local_10a8 [2];
  long *local_1098 [2];
  long local_1088 [2];
  long *local_1078 [2];
  long local_1068 [2];
  long *local_1058 [2];
  long local_1048 [2];
  long *local_1038;
  undefined8 local_1030;
  long local_1028 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  long *local_ff8 [2];
  long local_fe8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  long *local_fb8 [2];
  long local_fa8 [2];
  long *local_f98 [2];
  long local_f88 [2];
  long *local_f78 [2];
  long local_f68 [2];
  long *local_f58 [2];
  long local_f48 [2];
  long *local_f38 [2];
  long local_f28 [2];
  long *local_f18 [2];
  long local_f08 [2];
  long *local_ef8 [2];
  long local_ee8 [2];
  long *local_ed8 [2];
  long local_ec8 [2];
  long *local_eb8 [2];
  long local_ea8 [2];
  long *local_e98 [2];
  long local_e88 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_e78;
  long *local_e58 [2];
  long local_e48 [2];
  pointer local_e38 [2];
  undefined1 local_e28 [152];
  RPCResult local_d90;
  RPCResult local_d08;
  RPCResult local_c80;
  RPCResult local_bf8;
  RPCResult local_b70;
  RPCResult local_ae8;
  RPCResult local_a60;
  RPCResult local_9d8;
  RPCResult local_950;
  RPCResult local_8c8;
  RPCResult local_840;
  RPCResult local_7b8;
  RPCResult local_730;
  RPCResult local_6a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_620;
  long *local_600 [2];
  long local_5f0 [2];
  long *local_5e0 [2];
  long local_5d0 [2];
  RPCResult local_5c0;
  RPCResult local_538;
  undefined1 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  undefined1 local_488 [32];
  long *local_468 [2];
  long local_458 [2];
  UniValue local_448;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  undefined1 local_398;
  long *local_390 [2];
  long local_380 [2];
  undefined1 local_370;
  vector<RPCArg,_std::allocator<RPCArg>_> local_368;
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  long *local_328 [2];
  long local_318 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getblockheader","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nIf verbose is false, returns a string that is serialized, hex-encoded data for blockheader \'hash\'.\nIf verbose is true, returns an Object with information about blockheader <hash>.\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"blockhash","");
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"The block hash","");
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_370 = 0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_2_ = 0;
  local_348._10_6_ = 0;
  local_348._16_2_ = 0;
  local_348._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  name.field_2._8_8_ = in_stack_ffffffffffffea60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffea68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffea78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffea80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeaa0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeaa8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeab0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffeab8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeac0;
  description_16._M_string_length = in_stack_ffffffffffffead0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeac8;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffead8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffeae0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeaf0;
  opts._0_8_ = in_stack_ffffffffffffeae8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeaf8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb00;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeb08;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb10;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeb18;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeb20;
  opts._64_8_ = in_stack_ffffffffffffeb28;
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_16,opts);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"verbose","");
  local_1351 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_448,&local_1351);
  paVar1 = &local_448.val.field_2;
  local_3f0._8_8_ = (long)&local_3f0 + 0x18;
  local_3f0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_448.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p == paVar1) {
    local_3f0._32_8_ = local_448.val.field_2._8_8_;
  }
  else {
    local_3f0._8_8_ = local_448.val._M_dataplus._M_p;
  }
  local_3f0._16_8_ = local_448.val._M_string_length;
  local_448.val._M_string_length = 0;
  local_448.val.field_2._M_local_buf[0] = '\0';
  local_3f0._40_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f0._48_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3f0._56_8_ =
       local_448.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0._64_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_3f0._68_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_3f0._72_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_3f0._76_4_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_3f0._80_8_ =
       local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = 2;
  local_468[0] = local_458;
  local_448.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,"true for a json object, false for the hex-encoded data","");
  local_4a8 = &local_498;
  local_4b0 = 0;
  local_4a0 = 0;
  local_498 = 0;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_2_ = 0;
  local_488._10_6_ = 0;
  local_488._16_2_ = 0;
  local_488._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  name_00.field_2._8_8_ = in_stack_ffffffffffffea60;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea70;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffea68;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffea78;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffea80;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea88;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea90;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea98;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeaa0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeaa8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeab0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffeab8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffeac0;
  description_17._M_string_length = in_stack_ffffffffffffead0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeac8;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffead8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffeae0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeaf0;
  opts_00._0_8_ = in_stack_ffffffffffffeae8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeaf8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb00;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeb08;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb10;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeb18;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeb20;
  opts_00._64_8_ = in_stack_ffffffffffffeb28;
  RPCArg::RPCArg(&local_180,name_00,(Type)local_390,fallback_00,description_17,opts_00);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1350,__l,&local_1352);
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"for verbose = true","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"");
  local_620.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_620.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"");
  local_e38[0] = (pointer)local_e28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e38,"hash","");
  local_e58[0] = local_e48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e58,"the block hash (same as provided)","");
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffea60;
  description._M_string_length = in_stack_ffffffffffffea70;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffea90;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffea88;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult
            ((RPCResult *)(local_e28 + 0x10),STR_HEX,m_key_name,description,inner,SUB81(local_e38,0)
            );
  local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e78,"confirmations","");
  local_e98[0] = local_e88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e98,
             "The number of confirmations, or -1 if the block is not on the main chain","");
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_00._M_string_length = in_stack_ffffffffffffea70;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_00.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_d90,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_e78,0));
  local_eb8[0] = local_ea8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb8,"height","");
  local_ed8[0] = local_ec8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ed8,"The block height or index","");
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_01._M_string_length = in_stack_ffffffffffffea70;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_01.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_d08,NUM,m_key_name_01,description_01,inner_01,SUB81(local_eb8,0));
  local_ef8[0] = local_ee8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ef8,"version","");
  local_f18[0] = local_f08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f18,"The block version","");
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1408.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_02._M_string_length = in_stack_ffffffffffffea70;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_02.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_c80,NUM,m_key_name_02,description_02,inner_02,SUB81(local_ef8,0));
  local_f38[0] = local_f28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f38,"versionHex","");
  local_f58[0] = local_f48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f58,"The block version formatted in hexadecimal","");
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_03._M_string_length = in_stack_ffffffffffffea70;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_03.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_bf8,STR_HEX,m_key_name_03,description_03,inner_03,SUB81(local_f38,0));
  local_f78[0] = local_f68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f78,"merkleroot","");
  local_f98[0] = local_f88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f98,"The merkle root","");
  local_1448.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1448.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1448.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_04._M_string_length = in_stack_ffffffffffffea70;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_04.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_b70,STR_HEX,m_key_name_04,description_04,inner_04,SUB81(local_f78,0));
  local_fb8[0] = local_fa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fb8,"time","");
  std::operator+(&local_fd8,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1468.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1468.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1468.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_05._M_string_length = in_stack_ffffffffffffea70;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_05.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_ae8,NUM_TIME,m_key_name_05,description_05,inner_05,SUB81(local_fb8,0))
  ;
  local_ff8[0] = local_fe8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ff8,"mediantime","");
  std::operator+(&local_1018,"The median block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_06._M_string_length = in_stack_ffffffffffffea70;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_06.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_a60,NUM_TIME,m_key_name_06,description_06,inner_06,SUB81(local_ff8,0))
  ;
  local_1038 = local_1028;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1038,"nonce","");
  local_1058[0] = local_1048;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1058,"The nonce","");
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_07._M_string_length = in_stack_ffffffffffffea70;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_07.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_9d8,NUM,m_key_name_07,description_07,inner_07,SUB81(&local_1038,0));
  local_1078[0] = local_1068;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1078,"bits","");
  local_1098[0] = local_1088;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1098,"The bits","");
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_08._M_string_length = in_stack_ffffffffffffea70;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_08.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_950,STR_HEX,m_key_name_08,description_08,inner_08,SUB81(local_1078,0))
  ;
  local_10b8[0] = local_10a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10b8,"difficulty","");
  local_10d8[0] = local_10c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10d8,"The difficulty","");
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_09._M_string_length = in_stack_ffffffffffffea70;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_09.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_8c8,NUM,m_key_name_09,description_09,inner_09,SUB81(local_10b8,0));
  local_10f8[0] = local_10e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10f8,"chainwork","");
  local_1118[0] = local_1108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1118,"Expected number of hashes required to produce the current chain",
             "");
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_10._M_string_length = (size_type)in_RDI;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_10._M_string_length = in_stack_ffffffffffffea70;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_10.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_840,STR_HEX,m_key_name_10,description_10,inner_10,SUB81(local_10f8,0))
  ;
  local_1138[0] = local_1128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1138,"nTx","");
  local_1158[0] = local_1148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1158,"The number of transactions in the block","");
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  m_key_name_11._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea48;
  m_key_name_11._M_string_length = (size_type)in_RDI;
  m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffea60;
  description_11._M_string_length = in_stack_ffffffffffffea70;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_11.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult(&local_7b8,NUM,m_key_name_11,description_11,inner_11,SUB81(local_1138,0));
  local_1178[0] = local_1168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"previousblockhash","");
  local_1198[0] = local_1188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1198,"The hash of the previous block (if available)","");
  pRVar19 = (pointer)0x0;
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_ffffffffffffea4c;
  auVar5._12_8_ = in_stack_ffffffffffffea58;
  auVar5._20_8_ = in_stack_ffffffffffffea60;
  auVar5._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffea70;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_12.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea98;
  RPCResult::RPCResult
            (&local_730,STR_HEX,(string)(auVar5 << 0x20),SUB81(local_1178,0),description_12,inner_12
             ,true);
  local_11b8[0] = local_11a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11b8,"nextblockhash","");
  local_11d8[0] = local_11c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11d8,"The hash of the next block (if available)","");
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  uVar11 = 0;
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = in_stack_ffffffffffffea4c;
  auVar6._12_8_ = in_stack_ffffffffffffea58;
  auVar6._20_8_ = in_stack_ffffffffffffea60;
  auVar6._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffea70;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  description_13.field_2._8_8_ = in_stack_ffffffffffffea80;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffea90;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea88;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  RPCResult::RPCResult
            (&local_6a8,STR_HEX,(string)(auVar6 << 0x20),SUB81(local_11b8,0),description_13,inner_13
             ,true);
  __l_00._M_len = 0xf;
  __l_00._M_array = (iterator)(local_e28 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1388,__l_00,(allocator_type *)&stack0xffffffffffffea97);
  cond._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  cond._M_dataplus._M_p._0_4_ = uVar11;
  cond._M_string_length = (size_type)in_RDI;
  cond.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  cond.field_2._8_8_ = in_stack_ffffffffffffea60;
  m_key_name_12._M_string_length = in_stack_ffffffffffffea70;
  m_key_name_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea68;
  m_key_name_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea78;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffea80;
  description_15._M_string_length = in_stack_ffffffffffffea90;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea88;
  description_15.field_2._M_allocated_capacity = (size_type)pRVar16;
  description_15.field_2._8_8_ = pRVar17;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeab0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar18;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar19;
  RPCResult::RPCResult(&local_5c0,cond,(Type)local_5e0,m_key_name_12,description_15,inner_14);
  local_11f8[0] = local_11e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11f8,"for verbose=false","");
  local_1218[0] = local_1208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1218,"");
  local_1238[0] = local_1228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1238,"A string that is serialized, hex-encoded data for block \'hash\'"
             ,"");
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  cond_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea4c;
  cond_00._M_dataplus._M_p._0_4_ = uVar11;
  cond_00._M_string_length = (size_type)in_RDI;
  cond_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea58;
  cond_00.field_2._8_8_ = in_stack_ffffffffffffea60;
  auVar4._8_8_ = pRVar16;
  auVar4._0_8_ = in_stack_ffffffffffffea90;
  auVar4._16_8_ = pRVar17;
  auVar4._24_8_ = 0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeab0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar18;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar19;
  RPCResult::RPCResult
            (&local_538,cond_00,(Type)local_11f8,
             (string)ZEXT1632(CONCAT88(in_stack_ffffffffffffea70,in_stack_ffffffffffffea68)),
             (string)(auVar4 << 0x40),inner_15);
  __l_01._M_len = 2;
  __l_01._M_array = &local_5c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1370,__l_01,(allocator_type *)&local_1298);
  local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b8,"getblockheader","");
  local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12d8,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"","");
  HelpExampleCli(&local_1298,&local_12b8,&local_12d8);
  local_1318._M_dataplus._M_p = (pointer)&local_1318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1318,"getblockheader","");
  local_1338._M_dataplus._M_p = (pointer)&local_1338.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1338,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"","");
  HelpExampleRpc(&local_12f8,&local_1318,&local_1338);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
    uVar9 = local_1298.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_12f8._M_string_length + local_1298._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
      uVar9 = local_12f8.field_2._M_allocated_capacity;
    }
    if (local_12f8._M_string_length + local_1298._M_string_length <= (ulong)uVar9) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_12f8,0,0,local_1298._M_dataplus._M_p,local_1298._M_string_length);
      goto LAB_002ae42e;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1298,local_12f8._M_dataplus._M_p,local_12f8._M_string_length);
LAB_002ae42e:
  local_1278 = &local_1268;
  puVar2 = (ulong *)(pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_1268 = paVar1->_M_allocated_capacity;
    uStack_1260 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_1268 = paVar1->_M_allocated_capacity;
    local_1278 = puVar2;
  }
  local_1250 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_1278 == &local_1268) {
    uStack_1240 = uStack_1260;
    local_1258 = &local_1248;
  }
  else {
    local_1258 = local_1278;
  }
  local_1248 = local_1268;
  local_1270 = 0;
  local_1268 = local_1268 & 0xffffffffffffff00;
  pcVar12 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:568:9)>
            ::_M_manager;
  description_14._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:568:9)>
       ::_M_invoke;
  description_14._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:568:9)>
                ::_M_manager;
  description_14.field_2._M_allocated_capacity = (size_type)pRVar13;
  description_14.field_2._8_8_ = pRVar14;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffea90;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar15;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar18;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffeab0;
  examples.m_examples._M_string_length = (size_type)pRVar20;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar19;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar21;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffead0;
  local_1278 = &local_1268;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffea58)),description_14,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar12 != (code *)0x0) {
    (*pcVar12)(&stack0xffffffffffffea58,&stack0xffffffffffffea58,3);
  }
  if (local_1258 != &local_1248) {
    operator_delete(local_1258,local_1248 + 1);
  }
  if (local_1278 != &local_1268) {
    operator_delete(local_1278,local_1268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1338._M_dataplus._M_p != &local_1338.field_2) {
    operator_delete(local_1338._M_dataplus._M_p,local_1338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1318._M_dataplus._M_p != &local_1318.field_2) {
    operator_delete(local_1318._M_dataplus._M_p,local_1318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
    operator_delete(local_1298._M_dataplus._M_p,local_1298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
    operator_delete(local_12d8._M_dataplus._M_p,local_12d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
    operator_delete(local_12b8._M_dataplus._M_p,local_12b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1370);
  lVar10 = 0x110;
  do {
    if ((long *)((long)local_5d0 + lVar10) != *(long **)((long)local_5e0 + lVar10)) {
      operator_delete(*(long **)((long)local_5e0 + lVar10),*(long *)((long)local_5d0 + lVar10) + 1);
    }
    if ((long *)((long)local_5f0 + lVar10) != *(long **)((long)local_600 + lVar10)) {
      operator_delete(*(long **)((long)local_600 + lVar10),*(long *)((long)local_5f0 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_620.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    plVar3 = *(long **)((long)&local_6a8.m_cond._M_dataplus._M_p + lVar10);
    plVar8 = (long *)(local_6a8.m_cond.field_2._M_local_buf + lVar10);
    if (plVar8 != plVar3) {
      operator_delete(plVar3,*plVar8 + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea78);
  if (local_1238[0] != local_1228) {
    operator_delete(local_1238[0],local_1228[0] + 1);
  }
  if (local_1218[0] != local_1208) {
    operator_delete(local_1218[0],local_1208[0] + 1);
  }
  if (local_11f8[0] != local_11e8) {
    operator_delete(local_11f8[0],local_11e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1388);
  lVar10 = 0x7f8;
  do {
    if ((long *)(local_e28 + lVar10) != *(long **)((long)local_e38 + lVar10)) {
      operator_delete(*(long **)((long)local_e38 + lVar10),*(long *)(local_e28 + lVar10) + 1);
    }
    if ((long *)((long)local_e48 + lVar10) != *(long **)((long)local_e58 + lVar10)) {
      operator_delete(*(long **)((long)local_e58 + lVar10),*(long *)((long)local_e48 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    if ((long *)((long)local_e88 + lVar10) != *(long **)((long)local_e98 + lVar10)) {
      operator_delete(*(long **)((long)local_e98 + lVar10),*(long *)((long)local_e88 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea98);
  if (local_11d8[0] != local_11c8) {
    operator_delete(local_11d8[0],local_11c8[0] + 1);
  }
  if (local_11b8[0] != local_11a8) {
    operator_delete(local_11b8[0],local_11a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeab8);
  if (local_1198[0] != local_1188) {
    operator_delete(local_1198[0],local_1188[0] + 1);
  }
  if (local_1178[0] != local_1168) {
    operator_delete(local_1178[0],local_1168[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffead8);
  if (local_1158[0] != local_1148) {
    operator_delete(local_1158[0],local_1148[0] + 1);
  }
  if (local_1138[0] != local_1128) {
    operator_delete(local_1138[0],local_1128[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeaf8);
  if (local_1118[0] != local_1108) {
    operator_delete(local_1118[0],local_1108[0] + 1);
  }
  if (local_10f8[0] != local_10e8) {
    operator_delete(local_10f8[0],local_10e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb18);
  if (local_10d8[0] != local_10c8) {
    operator_delete(local_10d8[0],local_10c8[0] + 1);
  }
  if (local_10b8[0] != local_10a8) {
    operator_delete(local_10b8[0],local_10a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14c8);
  if (local_1098[0] != local_1088) {
    operator_delete(local_1098[0],local_1088[0] + 1);
  }
  if (local_1078[0] != local_1068) {
    operator_delete(local_1078[0],local_1068[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14a8);
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0],local_1048[0] + 1);
  }
  if (local_1038 != local_1028) {
    operator_delete(local_1038,local_1028[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1488);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
    operator_delete(local_1018._M_dataplus._M_p,local_1018.field_2._M_allocated_capacity + 1);
  }
  if (local_ff8[0] != local_fe8) {
    operator_delete(local_ff8[0],local_fe8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd8._M_dataplus._M_p != &local_fd8.field_2) {
    operator_delete(local_fd8._M_dataplus._M_p,local_fd8.field_2._M_allocated_capacity + 1);
  }
  if (local_fb8[0] != local_fa8) {
    operator_delete(local_fb8[0],local_fa8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1448);
  if (local_f98[0] != local_f88) {
    operator_delete(local_f98[0],local_f88[0] + 1);
  }
  if (local_f78[0] != local_f68) {
    operator_delete(local_f78[0],local_f68[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1428);
  if (local_f58[0] != local_f48) {
    operator_delete(local_f58[0],local_f48[0] + 1);
  }
  if (local_f38[0] != local_f28) {
    operator_delete(local_f38[0],local_f28[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1408);
  if (local_f18[0] != local_f08) {
    operator_delete(local_f18[0],local_f08[0] + 1);
  }
  if (local_ef8[0] != local_ee8) {
    operator_delete(local_ef8[0],local_ee8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13e8);
  if (local_ed8[0] != local_ec8) {
    operator_delete(local_ed8[0],local_ec8[0] + 1);
  }
  if (local_eb8[0] != local_ea8) {
    operator_delete(local_eb8[0],local_ea8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13c8);
  if (local_e98[0] != local_e88) {
    operator_delete(local_e98[0],local_e88[0] + 1);
  }
  if (local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_e78.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13a8);
  if (local_e58[0] != local_e48) {
    operator_delete(local_e58[0],local_e48[0] + 1);
  }
  if (local_e38[0] != (pointer)local_e28) {
    operator_delete(local_e38[0],local_e28._0_8_ + 1);
  }
  if (local_620.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_620.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_620.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_620.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1350);
  lVar10 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar10));
    plVar3 = *(long **)((long)&local_308 + lVar10 + 0x40);
    plVar8 = (long *)((long)&local_308 + lVar10 + 0x50);
    if (plVar8 != plVar3) {
      operator_delete(plVar3,*plVar8 + 1);
    }
    plVar8 = (long *)((long)&local_308 + lVar10 + 0x28);
    plVar3 = *(long **)((long)&local_308 + lVar10 + 0x18);
    if (plVar8 != plVar3) {
      operator_delete(plVar3,*plVar8 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_350 + lVar10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar10));
    if ((long *)((long)local_380 + lVar10) != *(long **)((long)local_390 + lVar10)) {
      operator_delete(*(long **)((long)local_390 + lVar10),*(long *)((long)local_380 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x108;
  } while (lVar10 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_488);
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,CONCAT71(uStack_497,local_498) + 1);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_3f0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_448.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.val._M_dataplus._M_p != &local_448.val.field_2) {
    operator_delete(local_448.val._M_dataplus._M_p,
                    CONCAT71(local_448.val.field_2._M_allocated_capacity._1_7_,
                             local_448.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  if (local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_368.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblockheader()
{
    return RPCHelpMan{"getblockheader",
                "\nIf verbose is false, returns a string that is serialized, hex-encoded data for blockheader 'hash'.\n"
                "If verbose is true, returns an Object with information about blockheader <hash>.\n",
                {
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The block hash"},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{true}, "true for a json object, false for the hex-encoded data"},
                },
                {
                    RPCResult{"for verbose = true",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "hash", "the block hash (same as provided)"},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations, or -1 if the block is not on the main chain"},
                            {RPCResult::Type::NUM, "height", "The block height or index"},
                            {RPCResult::Type::NUM, "version", "The block version"},
                            {RPCResult::Type::STR_HEX, "versionHex", "The block version formatted in hexadecimal"},
                            {RPCResult::Type::STR_HEX, "merkleroot", "The merkle root"},
                            {RPCResult::Type::NUM_TIME, "time", "The block time expressed in " + UNIX_EPOCH_TIME},
                            {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                            {RPCResult::Type::NUM, "nonce", "The nonce"},
                            {RPCResult::Type::STR_HEX, "bits", "The bits"},
                            {RPCResult::Type::NUM, "difficulty", "The difficulty"},
                            {RPCResult::Type::STR_HEX, "chainwork", "Expected number of hashes required to produce the current chain"},
                            {RPCResult::Type::NUM, "nTx", "The number of transactions in the block"},
                            {RPCResult::Type::STR_HEX, "previousblockhash", /*optional=*/true, "The hash of the previous block (if available)"},
                            {RPCResult::Type::STR_HEX, "nextblockhash", /*optional=*/true, "The hash of the next block (if available)"},
                        }},
                    RPCResult{"for verbose=false",
                        RPCResult::Type::STR_HEX, "", "A string that is serialized, hex-encoded data for block 'hash'"},
                },
                RPCExamples{
                    HelpExampleCli("getblockheader", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
            + HelpExampleRpc("getblockheader", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 hash(ParseHashV(request.params[0], "hash"));

    bool fVerbose = true;
    if (!request.params[1].isNull())
        fVerbose = request.params[1].get_bool();

    const CBlockIndex* pblockindex;
    const CBlockIndex* tip;
    {
        ChainstateManager& chainman = EnsureAnyChainman(request.context);
        LOCK(cs_main);
        pblockindex = chainman.m_blockman.LookupBlockIndex(hash);
        tip = chainman.ActiveChain().Tip();
    }

    if (!pblockindex) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
    }

    if (!fVerbose)
    {
        DataStream ssBlock{};
        ssBlock << pblockindex->GetBlockHeader();
        std::string strHex = HexStr(ssBlock);
        return strHex;
    }

    return blockheaderToJSON(*tip, *pblockindex);
},
    };
}